

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_radix_tree.hpp
# Opt level: O3

int __thiscall
cinatra::radix_tree::insert
          (radix_tree *this,string *path,
          function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)> *handler,
          string *method)

{
  char cVar1;
  element_type *peVar2;
  ulong uVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  undefined8 uVar5;
  undefined8 this_00;
  int iVar6;
  uint start;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  size_type __pos;
  uint uVar7;
  pointer pcVar8;
  _Manager_type p_Var9;
  ulong __pos_00;
  bool bVar10;
  shared_ptr<cinatra::radix_tree_node> child_1;
  shared_ptr<cinatra::radix_tree_node> child;
  undefined1 local_1a9;
  element_type *local_1a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1a0;
  undefined1 local_198 [88];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  code *local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_128;
  _Any_data local_118;
  _Manager_type local_108;
  radix_tree_node *local_100;
  _Alloc_hider local_f8;
  _Alloc_hider local_f0;
  undefined1 local_e8 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  radix_tree_node *local_d0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c8;
  _Alloc_hider local_c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b8;
  _Alloc_hider local_a0;
  undefined8 local_80;
  _Alloc_hider local_60;
  undefined8 local_40;
  
  local_1a8 = (this->root).super___shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
  _Stack_1a0._M_pi =
       (this->root).super___shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (_Stack_1a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Stack_1a0._M_pi)->_M_use_count = (_Stack_1a0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Stack_1a0._M_pi)->_M_use_count = (_Stack_1a0._M_pi)->_M_use_count + 1;
    }
  }
  local_198._32_8_ = path->_M_string_length;
  local_108 = (_Manager_type)(long)(int)local_198._32_8_;
  local_198._24_8_ = 0;
  local_198._44_4_ = 0;
  pcVar8 = (pointer)0x0;
  local_198._48_8_ = path;
  aStack_128._8_8_ = method;
  local_118._M_unused._M_object = handler;
  local_118._8_8_ = this;
  do {
    uVar5 = local_198._48_8_;
    uVar7 = (uint)pcVar8;
    if ((int)local_198._32_4_ <= (int)uVar7) break;
    p_Var9 = local_108;
    if ((local_1a8->indices)._M_string_length != 0) {
      cVar1 = *(local_1a8->indices)._M_dataplus._M_p;
      if (cVar1 != '*') {
        if (*(char *)(*(long *)local_198._48_8_ + (long)(int)uVar7) == ':') {
          if (cVar1 == ':') {
            iVar6 = find_pos((radix_tree *)local_118._M_unused._8_8_,(string *)local_198._48_8_,'/',
                             uVar7);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_198 + 0x38),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar5,
                       (long)(int)(uVar7 + 1),(long)(int)(~uVar7 + iVar6));
            p_Var9 = local_108;
            uVar5 = local_198._56_8_;
            peVar2 = (((local_1a8->children).
                       super__Vector_base<std::shared_ptr<cinatra::radix_tree_node>,_std::allocator<std::shared_ptr<cinatra::radix_tree_node>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super___shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._64_8_ ==
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(peVar2->path)._M_string_length) {
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._64_8_ ==
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                bVar10 = false;
              }
              else {
                iVar6 = bcmp((void *)local_198._56_8_,*(void **)&peVar2->path,local_198._64_8_);
                bVar10 = iVar6 != 0;
              }
            }
            else {
              bVar10 = true;
            }
            if ((radix_tree_node *)uVar5 != (radix_tree_node *)(local_198 + 0x48)) {
              operator_delete((void *)uVar5,CONCAT71(local_198._73_7_,local_198[0x48]) + 1);
            }
            if (!bVar10) goto LAB_001ac1a8;
          }
        }
        else if ((*(char *)(*(long *)local_198._48_8_ + (long)(int)uVar7) != '*') && (cVar1 != ':'))
        goto LAB_001ac1a8;
      }
      local_198._24_8_ = 0xffffffff;
      break;
    }
LAB_001ac1a8:
    __pos_00 = (ulong)(int)uVar7;
    radix_tree_node::get_child((radix_tree_node *)&stack0xffffffffffffff40,(char)local_1a8);
    this_00 = local_118._M_unused._8_8_;
    uVar5 = local_198._48_8_;
    if ((radix_tree_node *)local_c0._M_p == (radix_tree_node *)0x0) {
      start = find_pos((radix_tree *)local_118._M_unused._8_8_,(string *)local_198._48_8_,':',uVar7)
      ;
      peVar2 = local_1a8;
      if (start == local_198._32_4_) {
        iVar6 = find_pos((radix_tree *)this_00,(string *)uVar5,'*',uVar7);
        peVar2 = local_1a8;
        cVar1 = *(char *)(*(long *)uVar5 + __pos_00);
        local_198._24_4_ = iVar6;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_198 + 0x38),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar5,
                   __pos_00,(long)(int)(iVar6 - uVar7));
        local_d0 = (radix_tree_node *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<cinatra::radix_tree_node,std::allocator<cinatra::radix_tree_node>,std::__cxx11::string>
                  (&local_c8,&local_d0,(allocator<cinatra::radix_tree_node> *)&local_1a9,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_198 + 0x38));
        radix_tree_node::insert_child
                  ((radix_tree_node *)local_198,(char)peVar2,
                   (shared_ptr<cinatra::radix_tree_node> *)(ulong)(uint)(int)cVar1);
        uVar5 = local_198._8_8_;
        local_1a8 = (element_type *)local_198._0_8_;
        _Var4._M_pi = _Stack_1a0._M_pi;
        local_198._0_8_ = (radix_tree_node *)0x0;
        local_198._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        _Stack_1a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5;
        if ((_Var4._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var4._M_pi),
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_ !=
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_);
        }
        if (local_c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8._M_pi);
        }
        if ((radix_tree_node *)local_198._56_8_ != (radix_tree_node *)(local_198 + 0x48)) {
          operator_delete((void *)local_198._56_8_,CONCAT71(local_198._73_7_,local_198[0x48]) + 1);
        }
        peVar2 = local_1a8;
        if ((int)local_198._24_4_ < (int)local_198._32_4_) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_198 + 0x38),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_198._48_8_,(long)(local_198._24_4_ + 1),0xffffffffffffffff);
          local_e8._8_8_ = 0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<cinatra::radix_tree_node,std::allocator<cinatra::radix_tree_node>,std::__cxx11::string>
                    (&local_d8,(radix_tree_node **)(local_e8 + 8),
                     (allocator<cinatra::radix_tree_node> *)&local_1a9,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_198 + 0x38));
          radix_tree_node::insert_child
                    ((radix_tree_node *)local_198,(char)peVar2,
                     (shared_ptr<cinatra::radix_tree_node> *)0x2a);
          uVar5 = local_198._8_8_;
          local_1a8 = (element_type *)local_198._0_8_;
          _Var4._M_pi = _Stack_1a0._M_pi;
          local_198._0_8_ = (radix_tree_node *)0x0;
          local_198._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          _Stack_1a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5;
          if ((_Var4._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var4._M_pi),
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_ !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_);
          }
          if (local_d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8._M_pi);
          }
          if ((radix_tree_node *)local_198._56_8_ != (radix_tree_node *)(local_198 + 0x48)) {
            operator_delete((void *)local_198._56_8_,CONCAT71(local_198._73_7_,local_198[0x48]) + 1)
            ;
          }
          local_198._44_4_ = local_198._44_4_ + 1;
        }
        peVar2 = local_1a8;
        std::function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>::function
                  ((function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)> *)
                   &stack0xffffffffffffff70,
                   (function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)> *)
                   local_118._M_unused._0_8_);
        iVar6 = radix_tree_node::add_handler
                          (peVar2,(function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>
                                   *)&stack0xffffffffffffff70,(string *)aStack_128._8_8_);
        local_198._24_8_ = CONCAT44(extraout_var_00,iVar6);
        if ((_func_void *)local_80 != (_func_void *)0x0) {
          (*(code *)local_80)(&stack0xffffffffffffff70,&stack0xffffffffffffff70,3);
        }
        bVar10 = false;
      }
      else {
        cVar1 = *(char *)(*(long *)uVar5 + __pos_00);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_198 + 0x38),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar5,
                   __pos_00,(long)(int)(start - uVar7));
        local_f0._M_p = (pointer)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<cinatra::radix_tree_node,std::allocator<cinatra::radix_tree_node>,std::__cxx11::string>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_e8,
                   (radix_tree_node **)&local_f0,(allocator<cinatra::radix_tree_node> *)&local_1a9,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_198 + 0x38));
        radix_tree_node::insert_child
                  ((radix_tree_node *)local_198,(char)peVar2,
                   (shared_ptr<cinatra::radix_tree_node> *)(ulong)(uint)(int)cVar1);
        uVar5 = local_198._8_8_;
        local_1a8 = (element_type *)local_198._0_8_;
        _Var4._M_pi = _Stack_1a0._M_pi;
        local_198._0_8_ = (radix_tree_node *)0x0;
        local_198._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        _Stack_1a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5;
        if ((_Var4._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var4._M_pi),
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_ !=
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._0_8_);
        }
        if ((radix_tree_node *)local_198._56_8_ != (radix_tree_node *)(local_198 + 0x48)) {
          operator_delete((void *)local_198._56_8_,CONCAT71(local_198._73_7_,local_198[0x48]) + 1);
        }
        uVar5 = local_198._48_8_;
        uVar7 = find_pos((radix_tree *)local_118._M_unused._8_8_,(string *)local_198._48_8_,'/',
                         start);
        peVar2 = local_1a8;
        pcVar8 = (pointer)(ulong)uVar7;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_198 + 0x38),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar5,
                   (long)(int)(start + 1),(long)(int)(~start + uVar7));
        local_100 = (radix_tree_node *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<cinatra::radix_tree_node,std::allocator<cinatra::radix_tree_node>,std::__cxx11::string>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_f8,&local_100,
                   (allocator<cinatra::radix_tree_node> *)&local_1a9,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_198 + 0x38));
        radix_tree_node::insert_child
                  ((radix_tree_node *)local_198,(char)peVar2,
                   (shared_ptr<cinatra::radix_tree_node> *)0x3a);
        uVar5 = local_198._8_8_;
        local_1a8 = (element_type *)local_198._0_8_;
        _Var4._M_pi = _Stack_1a0._M_pi;
        local_198._0_8_ = (radix_tree_node *)0x0;
        local_198._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        _Stack_1a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5;
        if ((_Var4._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var4._M_pi),
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_ !=
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._M_p !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._M_p);
        }
        if ((radix_tree_node *)local_198._56_8_ != (radix_tree_node *)(local_198 + 0x48)) {
          operator_delete((void *)local_198._56_8_,CONCAT71(local_198._73_7_,local_198[0x48]) + 1);
        }
        peVar2 = local_1a8;
        local_198._44_4_ = local_198._44_4_ + 1;
        if (uVar7 == local_198._32_4_) {
          std::function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>::
          function((function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)> *)
                   &stack0xffffffffffffff50,
                   (function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)> *)
                   local_118._M_unused._0_8_);
          iVar6 = radix_tree_node::add_handler
                            (peVar2,(function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>
                                     *)&stack0xffffffffffffff50,(string *)aStack_128._8_8_);
          local_198._24_8_ = CONCAT44(extraout_var_02,iVar6);
          if ((code *)local_a0._M_p != (code *)0x0) {
            (*(code *)local_a0._M_p)(&stack0xffffffffffffff50,&stack0xffffffffffffff50,3);
          }
          goto LAB_001ac769;
        }
        bVar10 = true;
      }
    }
    else {
      local_1a8 = (element_type *)local_c0._M_p;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&_Stack_1a0,&stack0xffffffffffffff48);
      peVar2 = local_1a8;
      if (*(char *)(*(long *)local_198._48_8_ + __pos_00) == ':') {
        local_198._44_4_ = local_198._44_4_ + 1;
        uVar7 = uVar7 + (int)(local_1a8->path)._M_string_length + 1;
        bVar10 = true;
        pcVar8 = (pointer)(ulong)uVar7;
        if (uVar7 == local_198._32_4_) {
          std::function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>::
          function((function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)> *)
                   &stack0xffffffffffffffb0,
                   (function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)> *)
                   local_118._M_unused._0_8_);
          iVar6 = radix_tree_node::add_handler
                            (peVar2,(function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>
                                     *)&stack0xffffffffffffffb0,(string *)aStack_128._8_8_);
          local_198._24_8_ = CONCAT44(extraout_var,iVar6);
          if ((_func_void *)local_40 != (_func_void *)0x0) {
            (*(code *)local_40)((function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>
                                 *)&stack0xffffffffffffffb0,
                                (function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>
                                 *)&stack0xffffffffffffffb0,3);
          }
LAB_001ac769:
          bVar10 = false;
          pcVar8 = (pointer)local_198._32_8_;
        }
      }
      else {
        uVar3 = (local_1a8->path)._M_string_length;
        if (uVar3 != 0) {
          __pos = 0;
          do {
            if (*(char *)(*(long *)local_198._48_8_ + __pos_00) !=
                (local_1a8->path)._M_dataplus._M_p[__pos]) {
              pcVar8 = (pointer)(__pos_00 & 0xffffffff);
              goto LAB_001ac7a1;
            }
            __pos_00 = __pos_00 + 1;
            __pos = __pos + 1;
          } while (((long)__pos_00 < (long)p_Var9) && (__pos < uVar3));
          pcVar8 = (pointer)(((ulong)pcVar8 & 0xffffffff) + __pos);
          if (__pos < uVar3) {
LAB_001ac7a1:
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_198 + 0x38),&local_1a8->path,__pos,0xffffffffffffffff);
            local_198._0_8_ = (radix_tree_node *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<cinatra::radix_tree_node,std::allocator<cinatra::radix_tree_node>,std::__cxx11::string>
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_198 + 8),
                       (radix_tree_node **)local_198,
                       (allocator<cinatra::radix_tree_node> *)&local_1a9,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_198 + 0x38));
            if ((radix_tree_node *)local_198._56_8_ != (radix_tree_node *)(local_198 + 0x48)) {
              operator_delete((void *)local_198._56_8_,
                              CONCAT71(local_198._73_7_,local_198[0x48]) + 1);
            }
            uVar5 = local_198._0_8_;
            peVar2 = local_1a8;
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_198._0_8_ + 0x20),&(local_1a8->handler).method);
            std::function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>::
            operator=((function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>
                       *)(uVar5 + 0x40),&(peVar2->handler).handler);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_198._0_8_ + 0xa0),&local_1a8->indices);
            std::
            vector<std::shared_ptr<cinatra::radix_tree_node>,_std::allocator<std::shared_ptr<cinatra::radix_tree_node>_>_>
            ::operator=((vector<std::shared_ptr<cinatra::radix_tree_node>,_std::allocator<std::shared_ptr<cinatra::radix_tree_node>_>_>
                         *)(local_198._0_8_ + 0xc0),&local_1a8->children);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_198 + 0x38),&local_1a8->path,0,__pos);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(&local_1a8->path,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_198 + 0x38));
            if ((radix_tree_node *)local_198._56_8_ != (radix_tree_node *)(local_198 + 0x48)) {
              operator_delete((void *)local_198._56_8_,
                              CONCAT71(local_198._73_7_,local_198[0x48]) + 1);
            }
            peVar2 = local_1a8;
            local_198._56_8_ = local_198 + 0x48;
            local_198._64_8_ = (void *)0x0;
            local_198[0x48] = '\0';
            local_130 = (code *)0x0;
            aStack_128._M_allocated_capacity = 0;
            local_140._M_allocated_capacity = 0;
            local_140._8_8_ = (pointer)0x0;
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(&(local_1a8->handler).method,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_198 + 0x38));
            std::function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>::
            operator=(&(peVar2->handler).handler,
                      (function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>
                       *)&local_140);
            if (local_130 != (code *)0x0) {
              (*local_130)(&local_140,&local_140,3);
            }
            if ((undefined1 *)local_198._56_8_ != local_198 + 0x48) {
              operator_delete((void *)local_198._56_8_,
                              CONCAT71(local_198._73_7_,local_198[0x48]) + 1);
            }
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_replace_aux(&local_1a8->indices,0,(local_1a8->indices)._M_string_length,1,
                           **(char **)local_198._0_8_);
            local_198._56_8_ = local_198._0_8_;
            local_198._64_8_ = local_198._8_8_;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(_Atomic_word *)(local_198._8_8_ + 8) = *(_Atomic_word *)(local_198._8_8_ + 8) + 1;
                UNLOCK();
              }
              else {
                *(_Atomic_word *)(local_198._8_8_ + 8) = *(_Atomic_word *)(local_198._8_8_ + 8) + 1;
              }
            }
            std::
            vector<std::shared_ptr<cinatra::radix_tree_node>,std::allocator<std::shared_ptr<cinatra::radix_tree_node>>>
            ::_M_assign_aux<std::shared_ptr<cinatra::radix_tree_node>const*>
                      ((vector<std::shared_ptr<cinatra::radix_tree_node>,std::allocator<std::shared_ptr<cinatra::radix_tree_node>>>
                        *)&local_1a8->children,local_198 + 0x38,local_198 + 0x48);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._64_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._64_8_);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_);
            }
          }
        }
        peVar2 = local_1a8;
        bVar10 = true;
        if ((int)pcVar8 == local_198._32_4_) {
          std::function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>::
          function((function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)> *)
                   &stack0xffffffffffffff90,
                   (function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)> *)
                   local_118._M_unused._0_8_);
          iVar6 = radix_tree_node::add_handler
                            (peVar2,(function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>
                                     *)&stack0xffffffffffffff90,(string *)aStack_128._8_8_);
          local_198._24_8_ = CONCAT44(extraout_var_01,iVar6);
          if ((code *)local_60._M_p != (code *)0x0) {
            (*(code *)local_60._M_p)
                      ((function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>
                        *)&stack0xffffffffffffff90,
                       (function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>
                        *)&stack0xffffffffffffff90,3);
          }
          goto LAB_001ac769;
        }
      }
    }
    if (local_b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8._M_pi);
    }
  } while (bVar10);
  uVar5 = local_198._24_8_;
  if (*(int *)(*local_118._M_unused._8_8_ + 0xd8) < (int)local_198._44_4_) {
    *(undefined4 *)(*local_118._M_unused._8_8_ + 0xd8) = local_198._44_4_;
  }
  if (_Stack_1a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1a0._M_pi);
  }
  return (int)uVar5;
}

Assistant:

int insert(
      const std::string &path,
      std::function<void(coro_http_request &req, coro_http_response &resp)>
          handler,
      const std::string &method) {
    auto root = this->root;
    int i = 0, n = path.size(), param_count = 0, code = 0;
    while (i < n) {
      if (!root->indices.empty() &&
          (root->indices[0] == type_asterisk || path[i] == type_asterisk ||
           (path[i] != type_colon && root->indices[0] == type_colon) ||
           (path[i] == type_colon && root->indices[0] != type_colon) ||
           (path[i] == type_colon && root->indices[0] == type_colon &&
            path.substr(i + 1, find_pos(path, type_slash, i) - i - 1) !=
                root->children[0]->path))) {
        code = -1;
        break;
      }

      auto child = root->get_child(path[i]);
      if (!child) {
        auto p = find_pos(path, type_colon, i);

        if (p == n) {
          p = find_pos(path, type_asterisk, i);

          root = root->insert_child(path[i], std::make_shared<radix_tree_node>(
                                                 path.substr(i, p - i)));

          if (p < n) {
            root = root->insert_child(
                type_asterisk,
                std::make_shared<radix_tree_node>(path.substr(p + 1)));
            ++param_count;
          }

          code = root->add_handler(handler, method);
          break;
        }

        root = root->insert_child(
            path[i], std::make_shared<radix_tree_node>(path.substr(i, p - i)));

        i = find_pos(path, type_slash, p);

        root = root->insert_child(
            type_colon,
            std::make_shared<radix_tree_node>(path.substr(p + 1, i - p - 1)));
        ++param_count;

        if (i == n) {
          code = root->add_handler(handler, method);
          break;
        }
      }
      else {
        root = child;

        if (path[i] == type_colon) {
          ++param_count;
          i += root->path.size() + 1;

          if (i == n) {
            code = root->add_handler(handler, method);
            break;
          }
        }
        else {
          auto j = 0UL;
          auto m = root->path.size();

          for (; i < n && j < m && path[i] == root->path[j]; ++i, ++j) {
          }

          if (j < m) {
            std::shared_ptr<radix_tree_node> child(
                std::make_shared<radix_tree_node>(root->path.substr(j)));
            child->handler = root->handler;
            child->indices = root->indices;
            child->children = root->children;

            root->path = root->path.substr(0, j);
            root->handler = {};
            root->indices = child->path[0];
            root->children = {child};
          }

          if (i == n) {
            code = root->add_handler(handler, method);
            break;
          }
        }
      }
    }

    if (param_count > this->root->max_params)
      this->root->max_params = param_count;

    return code;
  }